

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O2

mz_bool tdefl_compress_block(tdefl_compressor *d,mz_bool static_block)

{
  mz_uint16 (*pamVar1) [288];
  mz_uint16 *pmVar2;
  mz_uint16 *pmVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  byte *pbVar7;
  uint uVar8;
  mz_uint8 (*pamVar9) [288];
  mz_uint16 (*pamVar10) [288];
  uint uVar11;
  long lVar12;
  undefined1 *puVar13;
  mz_uint16 *pmVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  byte *pbVar22;
  mz_uint mVar23;
  ulong uVar24;
  ulong uVar25;
  ulong *puVar26;
  char cVar27;
  char cVar29;
  byte bVar30;
  mz_uint8 *pmVar31;
  mz_uint8 *pmVar32;
  uint uVar33;
  byte *pbVar34;
  ulong uVar35;
  ulong uVar36;
  bool bVar37;
  byte abStack_2b8 [320];
  mz_uint8 code_sizes_to_pack [320];
  short sVar28;
  
  if (static_block == 0) {
    d->m_huff_count[0][0x100] = 1;
    tdefl_optimize_huffman_table(d,0,0x120,0xf,0);
    tdefl_optimize_huffman_table(d,1,0x20,0xf,0);
    iVar15 = 0x11f;
    lVar12 = 0x9067;
    do {
      if (lVar12 - 0x8f49U < 0x102) {
        iVar15 = 0x101;
        break;
      }
      iVar15 = iVar15 + -1;
      lVar18 = lVar12 + -0x14;
      lVar12 = lVar12 + -1;
    } while (*(char *)((long)d->m_max_probes + lVar18) == '\0');
    lVar12 = 36999;
    iVar16 = 0x1f;
    do {
      iVar20 = 1;
      if (lVar12 - 0x9069U < 2) break;
      iVar20 = iVar16 + -1;
      lVar18 = lVar12 + -0x14;
      lVar12 = lVar12 + -1;
      iVar16 = iVar20;
    } while (*(char *)((long)d->m_max_probes + lVar18) == '\0');
    memcpy(code_sizes_to_pack,d->m_huff_code_sizes,(long)iVar15);
    memcpy(code_sizes_to_pack + iVar15,d->m_huff_code_sizes + 1,(long)iVar20);
    pamVar1 = d->m_huff_count + 2;
    pamVar10 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x10) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x12) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x14) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x16) = 0;
    pamVar10 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x18) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x1a) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x1c) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x1e) = 0;
    pamVar10 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x1e) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x20) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x22) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x24) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 0) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 2) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 4) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 6) = 0;
    pamVar10 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 8) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 10) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0xc) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0xe) = 0;
    pmVar2 = d->m_huff_count[2] + 0x12;
    pmVar3 = d->m_huff_count[2] + 0x11;
    uVar21 = 0;
    uVar11 = 0;
    uVar17 = 0;
    uVar36 = 0;
    uVar25 = 0xff;
    while( true ) {
      bVar30 = (byte)uVar25;
      uVar33 = (uint)uVar36;
      cVar29 = (char)uVar17;
      cVar27 = (char)uVar11;
      sVar28 = (short)uVar11;
      if (uVar21 == (uint)(iVar20 + iVar15)) break;
      bVar4 = code_sizes_to_pack[uVar21];
      uVar24 = (ulong)bVar4;
      if (uVar24 == 0) {
        if (uVar11 != 0) {
          if (uVar11 < 3) {
            (*pamVar1)[uVar25] = (*pamVar1)[uVar25] + sVar28;
            while (bVar37 = uVar11 != 0, uVar11 = uVar11 - 1, bVar37) {
              abStack_2b8[uVar36] = bVar30;
              uVar36 = (ulong)((int)uVar36 + 1);
            }
          }
          else {
            pmVar14 = d->m_huff_count[2] + 0x10;
            *pmVar14 = *pmVar14 + 1;
            abStack_2b8[uVar36] = 0x10;
            uVar36 = (ulong)(uVar33 + 2);
            abStack_2b8[uVar33 + 1] = cVar27 - 3;
          }
        }
        uVar17 = uVar17 + 1;
        if (uVar17 == 0x8a) {
          *pmVar2 = *pmVar2 + 1;
          iVar16 = (int)uVar36;
          abStack_2b8[uVar36] = 0x12;
          uVar36 = (ulong)(iVar16 + 2);
          abStack_2b8[iVar16 + 1] = 0x7f;
          goto LAB_00268d49;
        }
        uVar11 = 0;
      }
      else {
        uVar35 = uVar36;
        if (uVar17 != 0) {
          if (uVar17 < 3) {
            (*pamVar1)[0] = (*pamVar1)[0] + (short)uVar17;
            while (bVar37 = uVar17 != 0, uVar17 = uVar17 - 1, bVar37) {
              abStack_2b8[uVar35] = 0;
              uVar35 = (ulong)((int)uVar35 + 1);
            }
          }
          else {
            uVar35 = (ulong)(uVar33 + 2);
            bVar37 = uVar17 < 0xb;
            pmVar14 = pmVar2;
            if (bVar37) {
              pmVar14 = pmVar3;
            }
            *pmVar14 = *pmVar14 + 1;
            abStack_2b8[uVar36] = 0x12 - bVar37;
            abStack_2b8[uVar33 + 1] = (bVar37 * '\b' + cVar29) - 0xb;
          }
        }
        iVar16 = (int)uVar35;
        if (bVar4 == bVar30) {
          uVar11 = uVar11 + 1;
          uVar36 = uVar35;
          if (uVar11 == 6) {
            pmVar14 = d->m_huff_count[2] + 0x10;
            *pmVar14 = *pmVar14 + 1;
            abStack_2b8[uVar35] = 0x10;
            abStack_2b8[iVar16 + 1] = 3;
            uVar36 = (ulong)(iVar16 + 2);
            goto LAB_00268d49;
          }
        }
        else {
          if (uVar11 != 0) {
            if (uVar11 < 3) {
              (*pamVar1)[uVar25] = (*pamVar1)[uVar25] + sVar28;
              while (bVar37 = uVar11 != 0, uVar11 = uVar11 - 1, bVar37) {
                abStack_2b8[uVar35] = bVar30;
                uVar35 = (ulong)((int)uVar35 + 1);
              }
            }
            else {
              pmVar14 = d->m_huff_count[2] + 0x10;
              *pmVar14 = *pmVar14 + 1;
              abStack_2b8[uVar35] = 0x10;
              uVar35 = (ulong)(iVar16 + 2);
              abStack_2b8[iVar16 + 1] = cVar27 - 3;
            }
          }
          (*pamVar1)[uVar24] = (*pamVar1)[uVar24] + 1;
          uVar36 = (ulong)((int)uVar35 + 1);
          abStack_2b8[uVar35] = bVar4;
LAB_00268d49:
          uVar11 = 0;
        }
        uVar17 = 0;
      }
      uVar21 = uVar21 + 1;
      uVar25 = uVar24;
    }
    if (uVar11 == 0) {
      if (uVar17 != 0) {
        if (uVar17 < 3) {
          (*pamVar1)[0] = (*pamVar1)[0] + (short)uVar17;
          while( true ) {
            uVar33 = (uint)uVar36;
            bVar37 = uVar17 == 0;
            uVar17 = uVar17 - 1;
            if (bVar37) break;
            abStack_2b8[uVar36] = 0;
            uVar36 = (ulong)(uVar33 + 1);
          }
        }
        else {
          uVar11 = uVar33 + 1;
          uVar33 = uVar33 + 2;
          if (uVar17 < 0xb) {
            *pmVar3 = *pmVar3 + 1;
            abStack_2b8[uVar36] = 0x11;
            bVar30 = cVar29 - 3;
          }
          else {
            *pmVar2 = *pmVar2 + 1;
            abStack_2b8[uVar36] = 0x12;
            bVar30 = cVar29 - 0xb;
          }
          abStack_2b8[uVar11] = bVar30;
        }
      }
    }
    else if (uVar11 < 3) {
      (*pamVar1)[uVar25] = (*pamVar1)[uVar25] + sVar28;
      while( true ) {
        uVar33 = (uint)uVar36;
        bVar37 = uVar11 == 0;
        uVar11 = uVar11 - 1;
        if (bVar37) break;
        abStack_2b8[uVar36] = bVar30;
        uVar36 = (ulong)(uVar33 + 1);
      }
    }
    else {
      pmVar2 = d->m_huff_count[2] + 0x10;
      *pmVar2 = *pmVar2 + 1;
      uVar11 = uVar33 + 1;
      abStack_2b8[uVar36] = 0x10;
      uVar33 = uVar33 + 2;
      abStack_2b8[uVar11] = cVar27 - 3;
    }
    tdefl_optimize_huffman_table(d,2,0x13,7,0);
    uVar17 = 2 << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
    d->m_bit_buffer = uVar17;
    for (uVar11 = d->m_bits_in + 2; d->m_bits_in = uVar11, 7 < uVar11; uVar11 = uVar11 - 8) {
      pmVar32 = d->m_pOutput_buf;
      if (pmVar32 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar32 + 1;
        *pmVar32 = (mz_uint8)uVar17;
        uVar11 = d->m_bits_in;
        uVar17 = d->m_bit_buffer;
      }
      uVar17 = uVar17 >> 8;
      d->m_bit_buffer = uVar17;
    }
    if (0x1f < iVar15 - 0x101U) {
      __assert_fail("bits <= ((1U << len) - 1U)",
                    "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                    ,0x416,"void tdefl_start_dynamic_block(tdefl_compressor *)");
    }
    mVar23 = iVar15 - 0x101U << ((byte)uVar11 & 0x1f) | uVar17;
    d->m_bit_buffer = mVar23;
    for (uVar11 = uVar11 + 5; d->m_bits_in = uVar11, 7 < uVar11; uVar11 = uVar11 - 8) {
      pmVar32 = d->m_pOutput_buf;
      if (pmVar32 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar32 + 1;
        *pmVar32 = (mz_uint8)mVar23;
        uVar11 = d->m_bits_in;
        mVar23 = d->m_bit_buffer;
      }
      mVar23 = mVar23 >> 8;
      d->m_bit_buffer = mVar23;
    }
    if (0x1f < iVar20 - 1U) {
      __assert_fail("bits <= ((1U << len) - 1U)",
                    "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                    ,0x417,"void tdefl_start_dynamic_block(tdefl_compressor *)");
    }
    mVar23 = iVar20 - 1U << ((byte)uVar11 & 0x1f) | mVar23;
    d->m_bit_buffer = mVar23;
    for (uVar11 = uVar11 + 5; d->m_bits_in = uVar11, 7 < uVar11; uVar11 = uVar11 - 8) {
      pmVar32 = d->m_pOutput_buf;
      if (pmVar32 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar32 + 1;
        *pmVar32 = (mz_uint8)mVar23;
        uVar11 = d->m_bits_in;
        mVar23 = d->m_bit_buffer;
      }
      mVar23 = mVar23 >> 8;
      d->m_bit_buffer = mVar23;
    }
    uVar17 = 0x12;
    while ((uVar19 = 0xffffffff, -1 < (int)uVar17 &&
           (uVar19 = uVar17, d->m_huff_code_sizes[2]["\x10\x11\x12"[uVar17]] == '\0'))) {
      uVar17 = uVar17 - 1;
    }
    if ((int)uVar19 < 4) {
      uVar19 = 3;
    }
    if (0xf < uVar19 - 3) {
      __assert_fail("bits <= ((1U << len) - 1U)",
                    "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                    ,0x41d,"void tdefl_start_dynamic_block(tdefl_compressor *)");
    }
    uVar19 = uVar19 - 3 << ((byte)uVar11 & 0x1f) | mVar23;
    d->m_bit_buffer = uVar19;
    for (uVar11 = uVar11 + 4; d->m_bits_in = uVar11, 7 < uVar11; uVar11 = uVar11 - 8) {
      pmVar32 = d->m_pOutput_buf;
      if (pmVar32 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar32 + 1;
        *pmVar32 = (mz_uint8)uVar19;
        uVar11 = d->m_bits_in;
        uVar19 = d->m_bit_buffer;
      }
      uVar19 = uVar19 >> 8;
      d->m_bit_buffer = uVar19;
    }
    uVar8 = 3;
    if (3 < (int)uVar17) {
      uVar8 = uVar17;
    }
    for (uVar25 = 0; uVar25 != uVar8 + 1; uVar25 = uVar25 + 1) {
      uVar17 = (uint)d->m_huff_code_sizes[2]["\x10\x11\x12"[uVar25]];
      if (7 < uVar17) {
        __assert_fail("bits <= ((1U << len) - 1U)",
                      "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                      ,0x41f,"void tdefl_start_dynamic_block(tdefl_compressor *)");
      }
      uVar19 = uVar19 | uVar17 << ((byte)uVar11 & 0x1f);
      d->m_bit_buffer = uVar19;
      for (uVar11 = uVar11 + 3; d->m_bits_in = uVar11, 7 < uVar11; uVar11 = uVar11 - 8) {
        pmVar32 = d->m_pOutput_buf;
        if (pmVar32 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar32 + 1;
          *pmVar32 = (mz_uint8)uVar19;
          uVar11 = d->m_bits_in;
          uVar19 = d->m_bit_buffer;
        }
        uVar19 = uVar19 >> 8;
        d->m_bit_buffer = uVar19;
      }
    }
    uVar25 = 0;
    while (uVar17 = (uint)uVar25, uVar17 < uVar33) {
      uVar36 = uVar25 & 0xffffffff;
      bVar30 = abStack_2b8[uVar36];
      uVar25 = (ulong)bVar30;
      if (0x12 < uVar25) {
        __assert_fail("code < TDEFL_MAX_HUFF_SYMBOLS_2",
                      "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                      ,0x424,"void tdefl_start_dynamic_block(tdefl_compressor *)");
      }
      uVar6 = d->m_huff_codes[2][uVar25];
      bVar4 = d->m_huff_code_sizes[2][uVar25];
      if (uVar6 >> (bVar4 & 0x1f) != 0) {
        __assert_fail("bits <= ((1U << len) - 1U)",
                      "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                      ,0x425,"void tdefl_start_dynamic_block(tdefl_compressor *)");
      }
      uVar25 = uVar36 + 1;
      uVar19 = uVar19 | (uint)uVar6 << ((byte)uVar11 & 0x1f);
      d->m_bit_buffer = uVar19;
      for (uVar11 = uVar11 + bVar4; d->m_bits_in = uVar11, 7 < uVar11; uVar11 = uVar11 - 8) {
        pmVar32 = d->m_pOutput_buf;
        if (pmVar32 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar32 + 1;
          *pmVar32 = (mz_uint8)uVar19;
          uVar11 = d->m_bits_in;
          uVar19 = d->m_bit_buffer;
        }
        uVar19 = uVar19 >> 8;
        d->m_bit_buffer = uVar19;
      }
      if (0xf < bVar30) {
        bVar30 = "\x02\x03\a"[bVar30 - 0x10];
        if (abStack_2b8[uVar36 + 1] >> (bVar30 & 0x1f) != 0) {
          __assert_fail("bits <= ((1U << len) - 1U)",
                        "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                        ,0x427,"void tdefl_start_dynamic_block(tdefl_compressor *)");
        }
        uVar19 = uVar19 | (uint)abStack_2b8[uVar36 + 1] << ((byte)uVar11 & 0x1f);
        d->m_bit_buffer = uVar19;
        for (uVar11 = uVar11 + (int)(char)bVar30; d->m_bits_in = uVar11, 7 < uVar11;
            uVar11 = uVar11 - 8) {
          pmVar32 = d->m_pOutput_buf;
          if (pmVar32 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar32 + 1;
            *pmVar32 = (mz_uint8)uVar19;
            uVar11 = d->m_bits_in;
            uVar19 = d->m_bit_buffer;
          }
          uVar19 = uVar19 >> 8;
          d->m_bit_buffer = uVar19;
        }
        uVar25 = (ulong)(uVar17 + 2);
      }
    }
  }
  else {
    for (lVar12 = 0x8f4a; (int)lVar12 != 0x8fda; lVar12 = lVar12 + 1) {
      *(undefined1 *)((long)d->m_max_probes + lVar12 + -0x14) = 8;
    }
    puVar13 = (undefined1 *)((long)d->m_max_probes + lVar12 + -0x14);
    for (iVar15 = 0x90; iVar15 != 0x100; iVar15 = iVar15 + 1) {
      *puVar13 = 9;
      puVar13 = puVar13 + 1;
    }
    for (lVar12 = 0; (int)lVar12 != 0x18; lVar12 = lVar12 + 1) {
      puVar13[lVar12] = 7;
    }
    for (lVar18 = 0; (int)lVar18 != 8; lVar18 = lVar18 + 1) {
      puVar13[lVar12 + lVar18] = 8;
    }
    pamVar9 = d->m_huff_code_sizes;
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0x10) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0x11) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0x12) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0x13) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0x14) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0x15) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0x16) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0x17) = '\x05';
    pamVar9 = d->m_huff_code_sizes;
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0x18) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0x19) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0x1a) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0x1b) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0x1c) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0x1d) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0x1e) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0x1f) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 0) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 1) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 2) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 3) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 4) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 5) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 6) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 7) = '\x05';
    pamVar9 = d->m_huff_code_sizes;
    *(mz_uint8 *)((long)(pamVar9 + 1) + 8) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 9) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 10) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0xb) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0xc) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0xd) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0xe) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0xf) = '\x05';
    tdefl_optimize_huffman_table(d,0,0x120,0xf,1);
    tdefl_optimize_huffman_table(d,1,0x20,0xf,1);
    uVar19 = d->m_bit_buffer | 1 << (d->m_bits_in & 0x1f);
    d->m_bit_buffer = uVar19;
    for (uVar11 = d->m_bits_in + 2; d->m_bits_in = uVar11, 7 < uVar11; uVar11 = uVar11 - 8) {
      pmVar32 = d->m_pOutput_buf;
      if (pmVar32 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar32 + 1;
        *pmVar32 = (mz_uint8)uVar19;
        uVar11 = d->m_bits_in;
        uVar19 = d->m_bit_buffer;
      }
      uVar19 = uVar19 >> 8;
      d->m_bit_buffer = uVar19;
    }
  }
  uVar25 = 1;
  pbVar7 = d->m_pLZ_code_buf;
  puVar26 = (ulong *)d->m_pOutput_buf;
  uVar36 = (ulong)uVar19;
  pmVar32 = d->m_lz_code_buf;
  do {
    if (pbVar7 <= pmVar32) {
      d->m_pOutput_buf = (mz_uint8 *)puVar26;
      d->m_bits_in = 0;
      d->m_bit_buffer = 0;
      mVar23 = 0;
      uVar17 = 0;
      while( true ) {
        if (uVar11 == 0) {
          uVar6 = d->m_huff_codes[0][0x100];
          bVar30 = d->m_huff_code_sizes[0][0x100];
          if (uVar6 >> (bVar30 & 0x1f) == 0) {
            uVar11 = (uint)uVar6 << ((byte)uVar17 & 0x1f) | mVar23;
            d->m_bit_buffer = uVar11;
            uVar17 = bVar30 + uVar17;
            while( true ) {
              d->m_bits_in = uVar17;
              pmVar32 = d->m_pOutput_buf;
              if (uVar17 < 8) break;
              if (pmVar32 < d->m_pOutput_buf_end) {
                d->m_pOutput_buf = pmVar32 + 1;
                *pmVar32 = (mz_uint8)uVar11;
                uVar17 = d->m_bits_in;
                uVar11 = d->m_bit_buffer;
              }
              uVar11 = uVar11 >> 8;
              d->m_bit_buffer = uVar11;
              uVar17 = uVar17 - 8;
            }
            return (uint)(pmVar32 < d->m_pOutput_buf_end);
          }
          __assert_fail("bits <= ((1U << len) - 1U)",
                        "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                        ,0x49d,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
        }
        uVar25 = 0x10;
        if (uVar11 < 0x10) {
          uVar25 = (ulong)uVar11;
        }
        uVar33 = mz_bitmasks[uVar25] & (uint)uVar36;
        if (uVar33 >> ((byte)uVar25 & 0x1f) != 0) break;
        mVar23 = mVar23 | uVar33 << ((byte)uVar17 & 0x1f);
        d->m_bit_buffer = mVar23;
        for (uVar17 = uVar17 + (int)uVar25; d->m_bits_in = uVar17, 7 < uVar17; uVar17 = uVar17 - 8)
        {
          pmVar32 = d->m_pOutput_buf;
          if (pmVar32 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar32 + 1;
            *pmVar32 = (mz_uint8)mVar23;
            uVar17 = d->m_bits_in;
            mVar23 = d->m_bit_buffer;
          }
          mVar23 = mVar23 >> 8;
          d->m_bit_buffer = mVar23;
        }
        uVar36 = uVar36 >> ((byte)uVar25 & 0x3f);
        uVar11 = uVar11 - (int)uVar25;
      }
      __assert_fail("bits <= ((1U << len) - 1U)",
                    "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                    ,0x498,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
    }
    pmVar31 = pmVar32;
    if ((int)uVar25 == 1) {
      pmVar31 = pmVar32 + 1;
      uVar25 = (ulong)(*pmVar32 | 0x100);
    }
    uVar33 = (uint)uVar25;
    uVar17 = uVar33;
    if ((uVar25 & 1) == 0) {
      bVar30 = d->m_huff_code_sizes[0][*pmVar31];
      if (bVar30 == 0) {
        __assert_fail("d->m_huff_code_sizes[0][lit]",
                      "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                      ,0x472,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
      }
      pmVar32 = pmVar31 + 1;
      uVar36 = (ulong)d->m_huff_codes[0][*pmVar31] << ((byte)uVar11 & 0x3f) | uVar36;
      uVar11 = bVar30 + uVar11;
      if (((uVar25 & 2) == 0) && (pmVar32 < pbVar7)) {
        bVar30 = d->m_huff_code_sizes[0][pmVar31[1]];
        if (bVar30 == 0) {
          __assert_fail("d->m_huff_code_sizes[0][lit]",
                        "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                        ,0x479,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
        }
        pmVar32 = pmVar31 + 2;
        uVar17 = (uint)(uVar25 >> 1);
        uVar36 = uVar36 | (ulong)d->m_huff_codes[0][pmVar31[1]] << ((byte)uVar11 & 0x3f);
        uVar11 = uVar11 + bVar30;
        if (((uVar25 & 4) == 0) && (pmVar32 < pbVar7)) {
          bVar30 = *pmVar32;
          bVar4 = d->m_huff_code_sizes[0][bVar30];
          if (bVar4 == 0) {
            __assert_fail("d->m_huff_code_sizes[0][lit]",
                          "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                          ,0x480,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
          }
          pmVar32 = pmVar31 + 3;
          uVar36 = uVar36 | (ulong)d->m_huff_codes[0][bVar30] << ((byte)uVar11 & 0x3f);
          uVar11 = uVar11 + bVar4;
          uVar17 = uVar33 >> 2;
        }
      }
    }
    else {
      bVar30 = *pmVar31;
      bVar4 = d->m_huff_code_sizes[0][s_tdefl_len_sym[bVar30]];
      if (bVar4 == 0) {
        __assert_fail("d->m_huff_code_sizes[0][s_tdefl_len_sym[match_len]]",
                      "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                      ,0x45f,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
      }
      uVar6 = *(ushort *)(pmVar31 + 1);
      uVar33 = uVar6 & 0x1ff;
      pbVar22 = "" + (uVar6 >> 8);
      if (uVar6 < 0x200) {
        pbVar22 = "" + uVar33;
      }
      bVar5 = d->m_huff_code_sizes[1][*pbVar22];
      if (bVar5 == 0) {
        __assert_fail("d->m_huff_code_sizes[1][sym]",
                      "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                      ,0x46b,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
      }
      pmVar32 = pmVar31 + 3;
      pbVar34 = "" + uVar33;
      if (0x1ff < uVar6) {
        pbVar34 = "" + (uVar6 >> 8);
      }
      iVar20 = bVar4 + uVar11;
      iVar15 = iVar20 + (uint)""[bVar30];
      iVar16 = (uint)bVar5 + iVar15;
      uVar36 = (ulong)((uint)uVar6 & mz_bitmasks[*pbVar34]) << ((byte)iVar16 & 0x3f) |
               (ulong)d->m_huff_codes[1][*pbVar22] << ((byte)iVar15 & 0x3f) |
               (ulong)d->m_huff_codes[0][s_tdefl_len_sym[bVar30]] << ((byte)uVar11 & 0x3f) |
               (ulong)((uint)bVar30 & mz_bitmasks[""[bVar30]]) << ((byte)iVar20 & 0x3f) | uVar36;
      uVar11 = iVar16 + (uint)*pbVar34;
    }
    if (d->m_pOutput_buf_end <= puVar26) {
      return 0;
    }
    *puVar26 = uVar36;
    puVar26 = (ulong *)((long)puVar26 + (ulong)(uVar11 >> 3));
    uVar36 = uVar36 >> ((byte)uVar11 & 0x38);
    uVar11 = uVar11 & 7;
    uVar25 = (ulong)(uVar17 >> 1);
  } while( true );
}

Assistant:

static mz_bool tdefl_compress_block(tdefl_compressor *d, mz_bool static_block)
{
    if (static_block)
        tdefl_start_static_block(d);
    else
        tdefl_start_dynamic_block(d);
    return tdefl_compress_lz_codes(d);
}